

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

void cl_reset_writer(Curl_easy *data)

{
  Curl_cwriter *pCVar1;
  
  while (pCVar1 = (data->req).writer_stack, pCVar1 != (Curl_cwriter *)0x0) {
    (data->req).writer_stack = pCVar1->next;
    (*pCVar1->cwt->do_close)(data,pCVar1);
    (*Curl_cfree)(pCVar1);
  }
  return;
}

Assistant:

static void cl_reset_writer(struct Curl_easy *data)
{
  struct Curl_cwriter *writer = data->req.writer_stack;
  while(writer) {
    data->req.writer_stack = writer->next;
    writer->cwt->do_close(data, writer);
    free(writer);
    writer = data->req.writer_stack;
  }
}